

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseNumberingSystemOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  UBool UVar1;
  int32_t textLength;
  char16_t *p;
  char *name;
  NumberingSystem *ns_00;
  NumberingSystem *ns;
  UnicodeString local_f0;
  ConstChar16Ptr local_b0;
  UnicodeString local_a8;
  UErrorCode local_64;
  undefined1 local_60 [4];
  UErrorCode conversionStatus;
  CharString buffer;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  buffer._56_8_ = status;
  CharString::CharString((CharString *)local_60);
  local_64 = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString(&local_f0,segment);
  p = UnicodeString::getBuffer(&local_f0);
  ConstChar16Ptr::ConstChar16Ptr(&local_b0,p);
  textLength = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString(&local_a8,'\0',&local_b0,textLength);
  CharString::appendInvariantChars((CharString *)local_60,&local_a8,&local_64);
  UnicodeString::~UnicodeString(&local_a8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  if (local_64 == U_INVARIANT_CONVERSION_ERROR) {
    *(undefined4 *)buffer._56_8_ = 0x10113;
  }
  else {
    UVar1 = ::U_FAILURE(local_64);
    if (UVar1 == '\0') {
      name = CharString::data((CharString *)local_60);
      ns_00 = NumberingSystem::createInstanceByName(name,(UErrorCode *)buffer._56_8_);
      if (ns_00 != (NumberingSystem *)0x0) {
        UVar1 = ::U_FAILURE(*(UErrorCode *)buffer._56_8_);
        if (UVar1 == '\0') {
          SymbolsWrapper::setTo(&macros->symbols,ns_00);
          goto LAB_002eb635;
        }
      }
      *(undefined4 *)buffer._56_8_ = 0x10113;
    }
    else {
      *(UErrorCode *)buffer._56_8_ = local_64;
    }
  }
LAB_002eb635:
  CharString::~CharString((CharString *)local_60);
  return;
}

Assistant:

void blueprint_helpers::parseNumberingSystemOption(const StringSegment& segment, MacroProps& macros,
                                                   UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    NumberingSystem* ns = NumberingSystem::createInstanceByName(buffer.data(), status);
    if (ns == nullptr || U_FAILURE(status)) {
        // This is a skeleton syntax error; don't bubble up the low-level NumberingSystem error
        // throw new SkeletonSyntaxException("Unknown numbering system", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    macros.symbols.setTo(ns);
}